

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1552.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  char *pcVar9;
  timeval tVar10;
  int still_running;
  int num;
  undefined8 local_38;
  
  local_38 = in_RAX;
  tv_test_start = tutil_tvnow();
  iVar1 = curl_global_init(3);
  uVar8 = _stderr;
  if (iVar1 != 0) {
    uVar3 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar8,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1552.c"
                  ,0x2a,iVar1,uVar3);
    goto LAB_0010152a;
  }
  lVar4 = curl_multi_init();
  if (lVar4 == 0) {
    curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1552.c"
                  ,0x2c);
    iVar2 = 0x7b;
LAB_001013a8:
    iVar1 = 0;
    lVar5 = 0;
  }
  else {
    lVar5 = curl_easy_init();
    if (lVar5 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1552.c"
                    ,0x2e);
      iVar2 = 0x7c;
      goto LAB_001013a8;
    }
    iVar2 = curl_easy_setopt(lVar5,0x2712,URL);
    uVar8 = _stderr;
    if (iVar2 == 0) {
      iVar2 = curl_easy_setopt(lVar5,0x2a,1);
      uVar8 = _stderr;
      if (iVar2 != 0) {
        uVar3 = curl_easy_strerror(iVar2);
        pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        uVar7 = 0x31;
        goto LAB_00101502;
      }
      iVar2 = curl_easy_setopt(lVar5,0x29,1);
      uVar8 = _stderr;
      if (iVar2 != 0) {
        uVar3 = curl_easy_strerror(iVar2);
        pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        uVar7 = 0x32;
        goto LAB_00101502;
      }
      iVar2 = curl_easy_setopt(lVar5,0x2715,"u:s");
      uVar8 = _stderr;
      if (iVar2 != 0) {
        uVar3 = curl_easy_strerror(iVar2);
        pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        uVar7 = 0x33;
        goto LAB_00101502;
      }
      iVar2 = curl_multi_add_handle(lVar4,lVar5);
      uVar8 = _stderr;
      if (iVar2 != 0) {
        uVar3 = curl_multi_strerror(iVar2);
        pcVar9 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
        uVar7 = 0x35;
        goto LAB_00101502;
      }
      iVar2 = curl_multi_perform(lVar4,&local_38);
      uVar8 = _stderr;
      if (iVar2 != 0) {
        uVar3 = curl_multi_strerror(iVar2);
        pcVar9 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
        uVar7 = 0x37;
        goto LAB_00101502;
      }
      if ((int)local_38 < 0) {
        iVar1 = 0;
        curl_mfprintf(_stderr,
                      "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1552.c"
                      ,0x37);
        iVar2 = 0x7a;
      }
      else {
        tVar10 = tutil_tvnow();
        lVar6 = tutil_tvdiff(tVar10,tv_test_start);
        if (lVar6 < 0xea61) {
          if ((int)local_38 != 0) {
            iVar1 = -4;
            do {
              iVar1 = iVar1 + 1;
              if (iVar1 == 0) break;
              iVar2 = curl_multi_wait(lVar4,0,0,60000,(long)&local_38 + 4);
              if (iVar2 != 0) {
                curl_mprintf("curl_multi_wait() returned %d\n",iVar2);
                iVar2 = 0x7e;
                goto LAB_0010176b;
              }
              tVar10 = tutil_tvnow();
              lVar6 = tutil_tvdiff(tVar10,tv_test_start);
              if (60000 < lVar6) {
                uVar8 = 0x44;
LAB_0010175f:
                curl_mfprintf(_stderr,
                              "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1552.c"
                              ,uVar8);
                iVar2 = 0x7d;
                goto LAB_0010176b;
              }
              iVar2 = curl_multi_perform(lVar4,&local_38);
              uVar8 = _stderr;
              if (iVar2 != 0) {
                uVar3 = curl_multi_strerror(iVar2);
                curl_mfprintf(uVar8,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1552.c"
                              ,0x46,iVar2,uVar3);
                goto LAB_0010176b;
              }
              if ((int)local_38 < 0) {
                curl_mfprintf(_stderr,
                              "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1552.c"
                              ,0x46);
                iVar2 = 0x7a;
                goto LAB_0010176b;
              }
              tVar10 = tutil_tvnow();
              lVar6 = tutil_tvdiff(tVar10,tv_test_start);
              if (60000 < lVar6) {
                uVar8 = 0x48;
                goto LAB_0010175f;
              }
            } while ((int)local_38 != 0);
          }
          lVar6 = curl_multi_info_read(lVar4,&local_38);
          iVar2 = 0;
          if (lVar6 == 0) {
LAB_0010176b:
            iVar1 = 0;
          }
          else {
            iVar1 = *(int *)(lVar6 + 0x10);
          }
        }
        else {
          iVar1 = 0;
          curl_mfprintf(_stderr,
                        "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1552.c"
                        ,0x39);
          iVar2 = 0x7d;
        }
      }
    }
    else {
      uVar3 = curl_easy_strerror(iVar2);
      pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      uVar7 = 0x30;
LAB_00101502:
      iVar1 = 0;
      curl_mfprintf(uVar8,pcVar9,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1552.c"
                    ,uVar7,iVar2,uVar3);
    }
  }
  curl_multi_cleanup(lVar4);
  curl_easy_cleanup(lVar5);
  curl_global_cleanup();
  if (iVar2 != 0) {
    iVar1 = iVar2;
  }
LAB_0010152a:
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *curls = NULL;
  CURLM *multi = NULL;
  int still_running;
  int i = 0;
  int res = 0;
  CURLMsg *msg;
  int counter = 3;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  multi_init(multi);

  easy_init(curls);

  easy_setopt(curls, CURLOPT_URL, URL);
  easy_setopt(curls, CURLOPT_HEADER, 1L);
  easy_setopt(curls, CURLOPT_VERBOSE, 1L);
  easy_setopt(curls, CURLOPT_USERPWD, "u:s");

  multi_add_handle(multi, curls);

  multi_perform(multi, &still_running);

  abort_on_test_timeout();

  while(still_running && counter--) {
    int num;
    res = curl_multi_wait(multi, NULL, 0, TEST_HANG_TIMEOUT, &num);
    if(res != CURLM_OK) {
      printf("curl_multi_wait() returned %d\n", res);
      res = TEST_ERR_MAJOR_BAD;
      goto test_cleanup;
    }

    abort_on_test_timeout();

    multi_perform(multi, &still_running);

    abort_on_test_timeout();
  }

  msg = curl_multi_info_read(multi, &still_running);
  if(msg)
    /* this should now contain a result code from the easy handle,
       get it */
    i = msg->data.result;

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(multi);
  curl_easy_cleanup(curls);
  curl_global_cleanup();

  if(res)
    i = res;

  return i; /* return the final return code */
}